

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  text local_138;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  text local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  text local_78;
  location local_58;
  
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"passed","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_138,local_d8,local_d8 + local_d0);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (where_->file)._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (where_->file)._M_string_length);
  local_58.line = where_->line;
  if (zen) {
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_f8,local_f8 + local_f0);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
  }
  else {
    std::operator+(&local_178," for ",decomposition_);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
  }
  std::operator+(&local_98,expr_,&local_158);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_118,local_118 + local_110);
  success::success(&this->super_success,&local_138,&local_58,&local_78,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (!zen) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (!zen) goto LAB_0015bab2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((zen) && (local_f8 != local_e8)) {
    operator_delete(local_f8);
  }
LAB_0015bab2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001b9be0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}